

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3SegReaderStep(Fts3Table *p,Fts3MultiSegReader *pCsr)

{
  uint uVar1;
  Fts3SegReader **apSegment;
  Fts3HashElem **ppFVar2;
  bool bVar3;
  byte bVar4;
  Fts3MultiSegReader *pFVar5;
  byte *pbVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uchar *q;
  char *pcVar10;
  long lVar11;
  byte *pbVar12;
  undefined4 uVar13;
  ulong uVar14;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar15;
  byte *pbVar16;
  int iVar17;
  Fts3SegReader *pFVar18;
  byte *pbVar19;
  ulong uVar20;
  size_t __n;
  long lVar21;
  ulong uVar22;
  byte *pbVar23;
  char *pList;
  int nList;
  uint local_b0;
  byte *local_a0;
  uint local_94;
  undefined8 local_90;
  ulong local_88;
  Fts3MultiSegReader *local_80;
  Fts3Table *local_78;
  Fts3SegFilter *local_70;
  uint local_64;
  ulong local_60;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = (ulong)(uint)pCsr->nSegment;
  local_58 = fts3SegReaderDoclistCmpRev;
  if (p->bDescIdx == '\0') {
    local_58 = fts3SegReaderDoclistCmp;
  }
  if (local_50 == 0) {
    return 0;
  }
  local_70 = pCsr->pFilter;
  apSegment = pCsr->apSegment;
  uVar1 = local_70->flags;
  uVar15 = (ulong)(uint)pCsr->nAdvance;
  local_64 = (uVar1 & 0x10) >> 4;
  local_80 = pCsr;
  local_78 = p;
  do {
    uVar22 = local_50;
    pFVar5 = local_80;
    iVar17 = (int)uVar15;
    if (0 < iVar17) {
      lVar21 = 0;
      do {
        pFVar18 = apSegment[lVar21];
        if (pFVar18->bLookup == '\0') {
          iVar17 = fts3SegReaderNext(p,pFVar18,(int)in_RDX);
          in_RDX = extraout_RDX_00;
          if (iVar17 != 0) {
            return iVar17;
          }
        }
        else {
          fts3SegReaderSetEof(pFVar18);
          in_RDX = extraout_RDX;
        }
        lVar21 = lVar21 + 1;
        iVar17 = pFVar5->nAdvance;
      } while (lVar21 < iVar17);
    }
    fts3SegReaderSort(apSegment,(int)uVar22,iVar17,fts3SegReaderCmp);
    pFVar5->nAdvance = 0;
    pFVar18 = *apSegment;
    if (pFVar18->aNode == (char *)0x0) {
      return 0;
    }
    iVar17 = pFVar18->nTerm;
    pFVar5->nTerm = iVar17;
    pcVar10 = pFVar18->zTerm;
    pFVar5->zTerm = pcVar10;
    if (local_70->zTerm != (char *)0x0 && (char)local_64 == '\0') {
      iVar8 = local_70->nTerm;
      if (iVar17 < iVar8) {
        return 0;
      }
      if ((uVar1 & 8) == 0 && iVar8 < iVar17) {
        return 0;
      }
      iVar8 = bcmp(pcVar10,local_70->zTerm,(long)iVar8);
      if (iVar8 != 0) {
        return 0;
      }
    }
    uVar15 = 1;
    if (1 < (int)uVar22) {
      uVar15 = 1;
      do {
        pFVar18 = apSegment[uVar15];
        if (((pFVar18->aNode == (char *)0x0) || (pFVar18->nTerm != iVar17)) ||
           (iVar8 = bcmp(pcVar10,pFVar18->zTerm,(long)iVar17), iVar8 != 0)) goto LAB_001b6047;
        uVar15 = uVar15 + 1;
      } while (uVar22 != uVar15);
      uVar15 = uVar22 & 0xffffffff;
    }
LAB_001b6047:
    p = local_78;
    iVar17 = (int)uVar15;
    if ((iVar17 == 1) && ((uVar1 & 0x22) == 0)) {
      pFVar18 = *apSegment;
      ppFVar2 = pFVar18->ppNextElem;
      if (local_78->bDescIdx == '\0') {
        iVar17 = pFVar18->nDoclist;
        pFVar5->nDoclist = iVar17;
        if (ppFVar2 == (Fts3HashElem **)0x0) goto LAB_001b653e;
        iVar17 = fts3MsrBufferData(pFVar5,pFVar18->aDoclist,iVar17);
        pFVar5->aDoclist = pFVar5->aBuffer;
        if (iVar17 != 0) goto LAB_001b654b;
      }
      else {
        if (ppFVar2 != (Fts3HashElem **)0x0) goto LAB_001b607b;
        pFVar5->nDoclist = pFVar18->nDoclist;
LAB_001b653e:
        pFVar5->aDoclist = pFVar18->aDoclist;
      }
      iVar17 = 100;
LAB_001b654b:
      pFVar5->nAdvance = 1;
      return iVar17;
    }
LAB_001b607b:
    local_40 = uVar15 & 0xffffffff;
    uVar22 = 0;
    local_60 = uVar15;
    do {
      fts3SegReaderFirstDocid((Fts3Table *)(ulong)p->bDescIdx,apSegment[uVar22]);
      uVar15 = local_60;
      uVar22 = uVar22 + 1;
    } while (iVar17 + (uint)(iVar17 == 0) != uVar22);
    fts3SegReaderSort(apSegment,(int)local_60,(int)local_60,local_58);
    pFVar18 = *apSegment;
    in_RDX = extraout_RDX_01;
    if (pFVar18->pOffsetList != (char *)0x0) {
      local_b0 = 0;
      uVar22 = 0;
      do {
        local_a0 = (byte *)0x0;
        local_94 = 0;
        local_88 = pFVar18->iDocid;
        fts3SegReaderNextDocid(p,pFVar18,(char **)&local_a0,(int *)&local_94);
        uVar14 = local_40;
        uVar20 = 1;
        if (1 < (uint)uVar15) {
          uVar20 = 1;
          do {
            pFVar18 = apSegment[uVar20];
            if ((pFVar18->pOffsetList == (char *)0x0) || (pFVar18->iDocid != local_88))
            goto LAB_001b615c;
            fts3SegReaderNextDocid(p,pFVar18,(char **)0x0,(int *)0x0);
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          uVar20 = uVar14 & 0xffffffff;
        }
LAB_001b615c:
        if ((uVar1 & 4) != 0) {
          fts3ColumnFilter(local_70->iCol,0,(char **)&local_a0,(int *)&local_94);
        }
        if (0 < (int)local_94 || (uVar1 & 2) == 0) {
          uVar15 = uVar22 - local_88;
          if ((int)local_b0 < 1) {
            uVar15 = local_88 - uVar22;
          }
          if (p->bDescIdx == '\0') {
            uVar15 = local_88 - uVar22;
          }
          if (((long)uVar15 < 1) && (0 < (int)local_b0 || uVar15 != local_88)) {
            return 0x10b;
          }
          __n = (size_t)(int)local_94;
          uVar14 = uVar15;
          uVar9 = local_b0;
          do {
            uVar9 = uVar9 + 1;
            bVar3 = 0x7f < uVar14;
            uVar14 = uVar14 >> 7;
          } while (bVar3);
          iVar17 = (local_94 + 1 & -(uVar1 & 1)) + uVar9;
          local_90 = (ulong)local_94;
          local_48 = uVar22;
          if (local_80->nBuffer < iVar17) {
            uVar9 = iVar17 * 2;
            local_80->nBuffer = uVar9;
            pcVar10 = local_80->aBuffer;
            iVar17 = sqlite3_initialize();
            if (iVar17 != 0) {
              return 7;
            }
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            pcVar10 = (char *)sqlite3Realloc(pcVar10,(ulong)uVar9);
            if (pcVar10 == (char *)0x0) {
              return 7;
            }
            local_80->aBuffer = pcVar10;
          }
          p = local_78;
          pFVar5 = local_80;
          pbVar16 = (byte *)(local_80->aBuffer + (int)local_b0);
          if ((uVar1 & 0x20) == 0) {
            do {
              pbVar23 = pbVar16;
              bVar7 = (byte)uVar15;
              *pbVar23 = bVar7 | 0x80;
              local_b0 = local_b0 + 1;
              bVar3 = 0x7f < uVar15;
              pbVar16 = pbVar23 + 1;
              uVar15 = uVar15 >> 7;
            } while (bVar3);
            *pbVar23 = bVar7;
            uVar22 = local_88;
            if ((uVar1 & 1) != 0) {
              memcpy(local_80->aBuffer + (int)local_b0,local_a0,__n);
              iVar17 = (int)local_90 + local_b0;
              local_b0 = (int)local_90 + local_b0 + 1;
              pFVar5->aBuffer[iVar17] = '\0';
              uVar22 = local_88;
            }
          }
          else {
            bVar7 = *local_a0;
            uVar13 = 0;
            pbVar23 = local_a0;
            if (bVar7 == 1) {
              local_90 = (ulong)local_90._4_4_ << 0x20;
              iVar17 = 0;
            }
            else {
              iVar17 = 0;
              if (bVar7 == 2) {
                lVar21 = 0;
                uVar22 = uVar15;
                do {
                  lVar11 = lVar21;
                  bVar7 = (byte)uVar22;
                  pbVar16[lVar11] = bVar7 | 0x80;
                  bVar3 = 0x7f < uVar22;
                  lVar21 = lVar11 + 1;
                  uVar22 = uVar22 >> 7;
                } while (bVar3);
                pbVar16[lVar11] = bVar7;
                iVar17 = (int)lVar11 + 2;
                pbVar16[lVar11 + 1] = 2;
                bVar7 = *local_a0;
                uVar13 = 1;
              }
              local_90 = CONCAT44(local_90._4_4_,uVar13);
              pbVar19 = local_a0;
              if (1 < bVar7) {
                do {
                  bVar4 = bVar7 & 0x80;
                  bVar7 = pbVar19[1];
                  pbVar23 = pbVar19 + 1;
                  pbVar19 = pbVar19 + 1;
                } while ((bVar7 & 0xfe) != 0 || bVar4 != 0);
              }
            }
            pbVar19 = local_a0 + __n;
            while (pbVar23 < pbVar19) {
              iVar8 = sqlite3Fts3GetVarint((char *)(pbVar23 + 1),(sqlite_int64 *)&local_38);
              pbVar23 = pbVar23 + (long)iVar8 + 1;
              bVar7 = *pbVar23;
              if (bVar7 == 2) {
                if ((int)local_90 == 0) {
                  pbVar6 = pbVar16 + iVar17;
                  uVar22 = uVar15;
                  do {
                    pbVar12 = pbVar6;
                    bVar7 = (byte)uVar22;
                    *pbVar12 = bVar7 | 0x80;
                    iVar17 = iVar17 + 1;
                    bVar3 = 0x7f < uVar22;
                    pbVar6 = pbVar12 + 1;
                    uVar22 = uVar22 >> 7;
                  } while (bVar3);
                  *pbVar12 = bVar7;
                }
                pbVar16[iVar17] = 1;
                pbVar6 = pbVar16 + (iVar17 + 1);
                uVar22 = local_38;
                iVar8 = iVar17 + 1;
                do {
                  iVar17 = iVar8;
                  pbVar12 = pbVar6;
                  bVar7 = (byte)uVar22;
                  *pbVar12 = bVar7 | 0x80;
                  iVar8 = iVar17 + 1;
                  bVar3 = 0x7f < uVar22;
                  pbVar6 = pbVar12 + 1;
                  uVar22 = uVar22 >> 7;
                } while (bVar3);
                *pbVar12 = bVar7;
                iVar17 = iVar17 + 2;
                pbVar16[iVar8] = 2;
                bVar7 = *pbVar23;
                local_90 = CONCAT44(local_90._4_4_,1);
              }
              if (1 < bVar7) {
                do {
                  bVar4 = bVar7 & 0x80;
                  bVar7 = pbVar23[1];
                  pbVar23 = pbVar23 + 1;
                } while ((bVar7 & 0xfe) != 0 || bVar4 != 0);
              }
            }
            if ((int)local_90 != 0) {
              lVar21 = (long)iVar17;
              iVar17 = iVar17 + 1;
              pbVar16[lVar21] = 0;
            }
            local_b0 = local_b0 + iVar17;
            uVar22 = local_88;
            p = local_78;
            if (iVar17 == 0) {
              uVar22 = local_48;
            }
          }
        }
        uVar15 = local_60;
        iVar17 = (int)local_60;
        fts3SegReaderSort(apSegment,iVar17,(int)uVar20,local_58);
        pFVar18 = *apSegment;
      } while (pFVar18->pOffsetList != (char *)0x0);
      in_RDX = (ulong)local_b0;
      if (0 < (int)local_b0) {
        local_80->aDoclist = local_80->aBuffer;
        local_80->nDoclist = local_b0;
        local_80->nAdvance = iVar17;
        return 100;
      }
    }
    local_80->nAdvance = (int)uVar15;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SegReaderStep(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pCsr        /* Cursor object */
){
  int rc = SQLITE_OK;

  int isIgnoreEmpty =  (pCsr->pFilter->flags & FTS3_SEGMENT_IGNORE_EMPTY);
  int isRequirePos =   (pCsr->pFilter->flags & FTS3_SEGMENT_REQUIRE_POS);
  int isColFilter =    (pCsr->pFilter->flags & FTS3_SEGMENT_COLUMN_FILTER);
  int isPrefix =       (pCsr->pFilter->flags & FTS3_SEGMENT_PREFIX);
  int isScan =         (pCsr->pFilter->flags & FTS3_SEGMENT_SCAN);
  int isFirst =        (pCsr->pFilter->flags & FTS3_SEGMENT_FIRST);

  Fts3SegReader **apSegment = pCsr->apSegment;
  int nSegment = pCsr->nSegment;
  Fts3SegFilter *pFilter = pCsr->pFilter;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( pCsr->nSegment==0 ) return SQLITE_OK;

  do {
    int nMerge;
    int i;
  
    /* Advance the first pCsr->nAdvance entries in the apSegment[] array
    ** forward. Then sort the list in order of current term again.  
    */
    for(i=0; i<pCsr->nAdvance; i++){
      Fts3SegReader *pSeg = apSegment[i];
      if( pSeg->bLookup ){
        fts3SegReaderSetEof(pSeg);
      }else{
        rc = fts3SegReaderNext(p, pSeg, 0);
      }
      if( rc!=SQLITE_OK ) return rc;
    }
    fts3SegReaderSort(apSegment, nSegment, pCsr->nAdvance, fts3SegReaderCmp);
    pCsr->nAdvance = 0;

    /* If all the seg-readers are at EOF, we're finished. return SQLITE_OK. */
    assert( rc==SQLITE_OK );
    if( apSegment[0]->aNode==0 ) break;

    pCsr->nTerm = apSegment[0]->nTerm;
    pCsr->zTerm = apSegment[0]->zTerm;

    /* If this is a prefix-search, and if the term that apSegment[0] points
    ** to does not share a suffix with pFilter->zTerm/nTerm, then all 
    ** required callbacks have been made. In this case exit early.
    **
    ** Similarly, if this is a search for an exact match, and the first term
    ** of segment apSegment[0] is not a match, exit early.
    */
    if( pFilter->zTerm && !isScan ){
      if( pCsr->nTerm<pFilter->nTerm 
       || (!isPrefix && pCsr->nTerm>pFilter->nTerm)
       || memcmp(pCsr->zTerm, pFilter->zTerm, pFilter->nTerm) 
      ){
        break;
      }
    }

    nMerge = 1;
    while( nMerge<nSegment 
        && apSegment[nMerge]->aNode
        && apSegment[nMerge]->nTerm==pCsr->nTerm 
        && 0==memcmp(pCsr->zTerm, apSegment[nMerge]->zTerm, pCsr->nTerm)
    ){
      nMerge++;
    }

    assert( isIgnoreEmpty || (isRequirePos && !isColFilter) );
    if( nMerge==1 
     && !isIgnoreEmpty 
     && !isFirst 
     && (p->bDescIdx==0 || fts3SegReaderIsPending(apSegment[0])==0)
    ){
      pCsr->nDoclist = apSegment[0]->nDoclist;
      if( fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pCsr, apSegment[0]->aDoclist, pCsr->nDoclist);
        pCsr->aDoclist = pCsr->aBuffer;
      }else{
        pCsr->aDoclist = apSegment[0]->aDoclist;
      }
      if( rc==SQLITE_OK ) rc = SQLITE_ROW;
    }else{
      int nDoclist = 0;           /* Size of doclist */
      sqlite3_int64 iPrev = 0;    /* Previous docid stored in doclist */

      /* The current term of the first nMerge entries in the array
      ** of Fts3SegReader objects is the same. The doclists must be merged
      ** and a single term returned with the merged doclist.
      */
      for(i=0; i<nMerge; i++){
        fts3SegReaderFirstDocid(p, apSegment[i]);
      }
      fts3SegReaderSort(apSegment, nMerge, nMerge, xCmp);
      while( apSegment[0]->pOffsetList ){
        int j;                    /* Number of segments that share a docid */
        char *pList = 0;
        int nList = 0;
        int nByte;
        sqlite3_int64 iDocid = apSegment[0]->iDocid;
        fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
        j = 1;
        while( j<nMerge
            && apSegment[j]->pOffsetList
            && apSegment[j]->iDocid==iDocid
        ){
          fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
          j++;
        }

        if( isColFilter ){
          fts3ColumnFilter(pFilter->iCol, 0, &pList, &nList);
        }

        if( !isIgnoreEmpty || nList>0 ){

          /* Calculate the 'docid' delta value to write into the merged 
          ** doclist. */
          sqlite3_int64 iDelta;
          if( p->bDescIdx && nDoclist>0 ){
            iDelta = iPrev - iDocid;
          }else{
            iDelta = iDocid - iPrev;
          }
          if( iDelta<=0 && (nDoclist>0 || iDelta!=iDocid) ){
            return FTS_CORRUPT_VTAB;
          }
          assert( nDoclist>0 || iDelta==iDocid );

          nByte = sqlite3Fts3VarintLen(iDelta) + (isRequirePos?nList+1:0);
          if( nDoclist+nByte>pCsr->nBuffer ){
            char *aNew;
            pCsr->nBuffer = (nDoclist+nByte)*2;
            aNew = sqlite3_realloc(pCsr->aBuffer, pCsr->nBuffer);
            if( !aNew ){
              return SQLITE_NOMEM;
            }
            pCsr->aBuffer = aNew;
          }

          if( isFirst ){
            char *a = &pCsr->aBuffer[nDoclist];
            int nWrite;
           
            nWrite = sqlite3Fts3FirstFilter(iDelta, pList, nList, a);
            if( nWrite ){
              iPrev = iDocid;
              nDoclist += nWrite;
            }
          }else{
            nDoclist += sqlite3Fts3PutVarint(&pCsr->aBuffer[nDoclist], iDelta);
            iPrev = iDocid;
            if( isRequirePos ){
              memcpy(&pCsr->aBuffer[nDoclist], pList, nList);
              nDoclist += nList;
              pCsr->aBuffer[nDoclist++] = '\0';
            }
          }
        }

        fts3SegReaderSort(apSegment, nMerge, j, xCmp);
      }
      if( nDoclist>0 ){
        pCsr->aDoclist = pCsr->aBuffer;
        pCsr->nDoclist = nDoclist;
        rc = SQLITE_ROW;
      }
    }
    pCsr->nAdvance = nMerge;
  }while( rc==SQLITE_OK );

  return rc;
}